

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::TiledInputFile::Data::TileBufferTask::execute(TileBufferTask *this)

{
  exception *e;
  vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_> *in_stack_00000040;
  FrameBuffer *in_stack_00000048;
  int in_stack_00000054;
  exr_const_context_t in_stack_00000058;
  TileProcess *in_stack_00000060;
  
  Context::operator_cast_to__priv_exr_context_t_((Context *)0xb60ff8);
  anon_unknown_13::TileProcess::run_decode
            (in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000048,
             in_stack_00000040);
  return;
}

Assistant:

void TiledInputFile::Data::TileBufferTask::execute ()
{
    try
    {
        _tile->run_decode (
            *(_ifd->_ctxt),
            _ifd->partNumber,
            _outfb,
            _ifd->fill_list);
    }
    catch (std::exception &e)
    {
        _tile_group->record_failure (e.what ());
    }
    catch (...)
    {
        _tile_group->record_failure ("Unknown exception");
    }
}